

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

UBool haveAliasData(UErrorCode *pErrorCode)

{
  UBool UVar1;
  UDataMemory *pData;
  uint *puVar2;
  uint uVar3;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((gAliasDataInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
       (UVar1 = icu_63::umtx_initImplPreInit(&gAliasDataInitOnce), UVar1 == '\0')) {
      if (U_ZERO_ERROR < gAliasDataInitOnce.fErrCode) {
        *pErrorCode = gAliasDataInitOnce.fErrCode;
      }
    }
    else {
      ucln_common_registerCleanup_63(UCLN_COMMON_UCNV_IO,ucnv_io_cleanup);
      pData = udata_openChoice_63((char *)0x0,"icu","cnvalias",isAcceptable,(void *)0x0,pErrorCode);
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        puVar2 = (uint *)udata_getMemory_63(pData);
        uVar3 = *puVar2;
        if (uVar3 < 8) {
          *pErrorCode = U_INVALID_FORMAT_ERROR;
          udata_close_63(pData);
        }
        else {
          gMainTable.converterListSize = puVar2[1];
          gMainTable.tagListSize = puVar2[2];
          gMainTable.aliasListSize = puVar2[3];
          gMainTable.untaggedConvArraySize = puVar2[4];
          gMainTable.taggedAliasArraySize = puVar2[5];
          gMainTable.taggedAliasListsSize = puVar2[6];
          gMainTable.optionTableSize = puVar2[7];
          gMainTable.stringTableSize = puVar2[8];
          if (uVar3 != 8) {
            gMainTable.normalizedStringTableSize = puVar2[9];
          }
          gMainTable.converterList = (uint16_t *)((long)puVar2 + (ulong)(uVar3 * 2 + 2) * 2);
          uVar3 = gMainTable.converterListSize + uVar3 * 2 + 2;
          gMainTable.tagList = (uint16_t *)((long)puVar2 + (ulong)uVar3 * 2);
          uVar3 = gMainTable.tagListSize + uVar3;
          gMainTable.aliasList = (uint16_t *)((long)puVar2 + (ulong)uVar3 * 2);
          uVar3 = gMainTable.aliasListSize + uVar3;
          gMainTable.untaggedConvArray = (uint16_t *)((long)puVar2 + (ulong)uVar3 * 2);
          uVar3 = gMainTable.untaggedConvArraySize + uVar3;
          gMainTable.taggedAliasArray = (uint16_t *)((long)puVar2 + (ulong)uVar3 * 2);
          uVar3 = gMainTable.taggedAliasArraySize + uVar3;
          gMainTable.taggedAliasLists = (uint16_t *)((long)puVar2 + (ulong)uVar3 * 2);
          uVar3 = gMainTable.taggedAliasListsSize + uVar3;
          if ((gMainTable.optionTableSize == 0) ||
             (1 < *(ushort *)((long)puVar2 + (ulong)uVar3 * 2))) {
            gMainTable.optionTable = &defaultTableOptions;
          }
          else {
            gMainTable.optionTable = (UConverterAliasOptions *)((long)puVar2 + (ulong)uVar3 * 2);
          }
          gMainTable.stringTable =
               (uint16_t *)((long)puVar2 + (ulong)(gMainTable.optionTableSize + uVar3) * 2);
          gMainTable.normalizedStringTable =
               (uint16_t *)
               ((long)puVar2 +
               (ulong)(gMainTable.stringTableSize + gMainTable.optionTableSize + uVar3) * 2);
          gAliasData = pData;
          if ((gMainTable.optionTable)->stringNormalizationType == 0) {
            gMainTable.normalizedStringTable = gMainTable.stringTable;
          }
        }
      }
      gAliasDataInitOnce.fErrCode = *pErrorCode;
      icu_63::umtx_initImplPostInit(&gAliasDataInitOnce);
    }
  }
  return *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

static UBool
haveAliasData(UErrorCode *pErrorCode) {
    umtx_initOnce(gAliasDataInitOnce, &initAliasData, *pErrorCode);
    return U_SUCCESS(*pErrorCode);
}